

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

void __thiscall ncnn::ParamDict::ParamDict(ParamDict *this)

{
  undefined8 *puVar1;
  ParamDictPrivate *pPVar2;
  long lVar3;
  
  this->_vptr_ParamDict = (_func_int **)&PTR__ParamDict_005fd488;
  pPVar2 = (ParamDictPrivate *)operator_new(0xe00);
  lVar3 = 0x60;
  do {
    *(undefined8 *)((long)pPVar2->params + lVar3 + -0x18) = 0;
    puVar1 = (undefined8 *)((long)pPVar2->params + lVar3 + -0x58);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)pPVar2->params + lVar3 + -0x4c);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)pPVar2->params + lVar3 + -0x38);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)pPVar2->params + lVar3 + -0x2c);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(long *)((long)pPVar2->params + lVar3 + -0x10) = (long)&pPVar2->params[0].type + lVar3;
    *(undefined8 *)((long)pPVar2->params + lVar3 + -8) = 0;
    *(undefined1 *)((long)&pPVar2->params[0].type + lVar3) = 0;
    lVar3 = lVar3 + 0x70;
  } while (lVar3 != 0xe60);
  this->d = pPVar2;
  clear(this);
  return;
}

Assistant:

ParamDict::ParamDict()
    : d(new ParamDictPrivate)
{
    clear();
}